

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_AllowStringTypeForEdition2023_Test
::~CppGeneratorTest_AllowStringTypeForEdition2023_Test
          (CppGeneratorTest_AllowStringTypeForEdition2023_Test *this)

{
  CppGeneratorTest_AllowStringTypeForEdition2023_Test *this_local;
  
  CppGeneratorTest::~CppGeneratorTest(&this->super_CppGeneratorTest);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, AllowStringTypeForEdition2023) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    import "google/protobuf/cpp_features.proto";

    message Foo {
      int32 bar = 1;
      bytes baz = 2 [features.(pb.cpp).string_type = CORD];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");

  ExpectNoErrors();
}